

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lognormal_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::lognormal_dist<double>::pdf(lognormal_dist<double> *this,result_type_conflict2 x)

{
  param_type *in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  result_type_conflict2 rVar2;
  result_type_conflict2 rVar3;
  result_type_conflict2 t;
  undefined8 local_8;
  
  if (0.0 < in_XMM0_Qa) {
    dVar1 = math::ln(1.69393222850853e-317);
    rVar2 = param_type::mu(in_RDI);
    rVar3 = param_type::sigma(in_RDI);
    dVar1 = (dVar1 - rVar2) / rVar3;
    rVar2 = param_type::sigma(in_RDI);
    local_8 = exp((-dVar1 * dVar1) / 2.0);
    local_8 = (0.3989422804014327 / (in_XMM0_Qa * rVar2)) * local_8;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

pdf(result_type x) const {
      if (x <= 0)
        return 0;
      result_type t((math::ln(x) - P.mu()) / P.sigma());
      return math::constants<result_type>::one_over_sqrt_2pi / (x * P.sigma()) *
             math::exp(-t * t / 2);
    }